

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_search.c
# Opt level: O1

void update_txfm_count(MACROBLOCK *x,MACROBLOCKD *xd,FRAME_COUNTS *counts,TX_SIZE tx_size,int depth,
                      int blk_row,int blk_col,uint8_t allow_update_cdf)

{
  uint *puVar1;
  BLOCK_SIZE BVar2;
  byte bVar3;
  ushort uVar4;
  ushort uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  MB_MODE_INFO *pMVar9;
  TXFM_CONTEXT *pTVar10;
  TXFM_CONTEXT *pTVar11;
  FRAME_CONTEXT *pFVar12;
  uint uVar13;
  bool bVar14;
  TX_SIZE TVar15;
  uint uVar16;
  undefined7 in_register_00000009;
  ulong uVar17;
  TX_SIZE TVar18;
  uint __c;
  byte bVar19;
  uint __c_00;
  int iVar20;
  uint uVar21;
  int iVar22;
  long lVar23;
  ulong uVar24;
  int col;
  int iVar25;
  int offsetr;
  uint8_t in_stack_ffffffffffffff70;
  
  pMVar9 = *xd->mi;
  BVar2 = pMVar9->bsize;
  bVar19 = block_size_high[BVar2];
  uVar16 = (uint)bVar19;
  if (xd->mb_to_bottom_edge < 0) {
    uVar16 = (xd->mb_to_bottom_edge >> ((char)xd->plane[0].subsampling_y + 3U & 0x1f)) +
             (uint)bVar19;
  }
  bVar3 = block_size_wide[BVar2];
  uVar21 = (uint)bVar3;
  if (xd->mb_to_right_edge < 0) {
    uVar21 = (xd->mb_to_right_edge >> ((char)xd->plane[0].subsampling_x + 3U & 0x1f)) + uVar21;
  }
  pTVar10 = xd->above_txfm_context;
  pTVar11 = xd->left_txfm_context;
  TVar18 = (TX_SIZE)counts;
  uVar24 = (ulong)counts & 0xff;
  uVar17 = (ulong)(uint)((int)uVar24 * 4);
  __c_00 = (uint)*(byte *)((long)tx_size_wide + uVar17);
  __c = (uint)*(byte *)((long)tx_size_high + uVar17);
  if (TVar18 == '\0') {
    lVar23 = 0;
  }
  else {
    uVar13 = (uint)bVar19;
    if (bVar19 < bVar3) {
      uVar13 = (uint)bVar3;
    }
    bVar19 = 1;
    if (uVar13 < 0x20) {
      if (uVar13 == 8) {
        TVar15 = '\x01';
        bVar14 = false;
        bVar19 = 0;
      }
      else {
        if (uVar13 == 0x10) {
          TVar15 = '\x02';
          goto LAB_001f74c6;
        }
LAB_001f74d2:
        bVar14 = true;
        TVar15 = '\0';
        bVar19 = 1;
      }
    }
    else {
      TVar15 = '\x04';
      bVar14 = false;
      if ((uVar13 != 0x80) && (bVar14 = false, uVar13 != 0x40)) {
        if (uVar13 != 0x20) goto LAB_001f74d2;
        TVar15 = '\x03';
LAB_001f74c6:
        bVar14 = false;
      }
    }
    lVar23 = 0x3f;
    if (!bVar14) {
      lVar23 = (ulong)(byte)((bVar19 & ""[uVar24] != TVar15) + TVar15 * -2 + 8) * 3;
    }
    lVar23 = (ulong)(pTVar11[depth] < __c) + (ulong)(pTVar10[blk_row] < __c_00) + lVar23;
  }
  if (((int)uVar16 >> 2 <= depth) || ((int)uVar21 >> 2 <= blk_row)) {
    return;
  }
  if ((int)CONCAT71(in_register_00000009,tx_size) == 2) {
    pMVar9->tx_size = TVar18;
  }
  else {
    iVar22 = (blk_row >> (av1_get_txb_size_index_tw_w_log2_table[BVar2] & 0x1f)) +
             ((depth >> (av1_get_txb_size_index_tw_h_log2_table[BVar2] & 0x1f)) <<
             (av1_get_txb_size_index_stride_log2_table[BVar2] & 0x1f));
    if (pMVar9->inter_tx_size[iVar22] != TVar18) {
      bVar19 = ""[uVar24];
      uVar17 = (ulong)((uint)bVar19 * 4);
      iVar6 = *(int *)((long)tx_size_wide_unit + uVar17);
      iVar7 = *(int *)((long)tx_size_high_unit + uVar17);
      if ((char)blk_col != '\0') {
        pFVar12 = xd->tile_ctx;
        uVar4 = pFVar12->txfm_partition_cdf[lVar23][2];
        uVar5 = pFVar12->txfm_partition_cdf[lVar23][0];
        pFVar12->txfm_partition_cdf[lVar23][0] =
             (short)((int)(0x8000 - (uint)uVar5) >> ((char)(uVar4 >> 4) + 4U & 0x1f)) + uVar5;
        pFVar12->txfm_partition_cdf[lVar23][2] = uVar4 + (uVar4 < 0x20);
      }
      puVar1 = &(x->txfm_search_info).txb_split_count;
      *puVar1 = *puVar1 + 1;
      if ((99UL >> ((ulong)counts & 0x3f) & 1) == 0) {
        uVar17 = (ulong)(uint)((int)uVar24 * 4);
        iVar22 = *(int *)((long)tx_size_high_unit + uVar17);
        iVar8 = *(int *)((long)tx_size_wide_unit + uVar17);
        iVar20 = 0;
        do {
          iVar25 = 0;
          do {
            update_txfm_count(x,xd,(FRAME_COUNTS *)(ulong)bVar19,tx_size + '\x01',iVar20 + depth,
                              blk_row + iVar25,blk_col & 0xff,in_stack_ffffffffffffff70);
            iVar25 = iVar25 + iVar6;
          } while (iVar25 < iVar8);
          iVar20 = iVar20 + iVar7;
        } while (iVar20 < iVar22);
        return;
      }
      pMVar9->inter_tx_size[iVar22] = '\0';
      pMVar9->tx_size = '\0';
      pTVar10 = xd->above_txfm_context;
      bVar19 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
               [txsize_to_bsize[uVar24]];
      memset(xd->left_txfm_context + depth,4,
             (ulong)((uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                           [txsize_to_bsize[uVar24]] +
                     (uint)("\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                            [txsize_to_bsize[uVar24]] == 0) & 0xff));
      uVar16 = (uint)bVar19 + (uint)(bVar19 == 0);
      __c_00 = 4;
      goto LAB_001f764c;
    }
    if ((char)blk_col != '\0') {
      pFVar12 = xd->tile_ctx;
      uVar4 = pFVar12->txfm_partition_cdf[lVar23][2];
      uVar5 = pFVar12->txfm_partition_cdf[lVar23][0];
      pFVar12->txfm_partition_cdf[lVar23][0] = uVar5 - (uVar5 >> ((char)(uVar4 >> 4) + 4U & 0x1f));
      pFVar12->txfm_partition_cdf[lVar23][2] = uVar4 + (uVar4 < 0x20);
    }
    pMVar9->tx_size = TVar18;
  }
  bVar19 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
           [txsize_to_bsize[uVar24]];
  memset(pTVar11 + depth,__c,
         (ulong)((uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                       [txsize_to_bsize[uVar24]] +
                 (uint)("\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                        [txsize_to_bsize[uVar24]] == 0) & 0xff));
  uVar16 = (uint)bVar19 + (uint)(bVar19 == 0);
LAB_001f764c:
  memset(pTVar10 + blk_row,__c_00,(ulong)(uVar16 & 0xff));
  return;
}

Assistant:

static void update_txfm_count(MACROBLOCK *x, MACROBLOCKD *xd,
                              FRAME_COUNTS *counts, TX_SIZE tx_size, int depth,
                              int blk_row, int blk_col,
                              uint8_t allow_update_cdf) {
  MB_MODE_INFO *mbmi = xd->mi[0];
  const BLOCK_SIZE bsize = mbmi->bsize;
  const int max_blocks_high = max_block_high(xd, bsize, 0);
  const int max_blocks_wide = max_block_wide(xd, bsize, 0);
  int ctx = txfm_partition_context(xd->above_txfm_context + blk_col,
                                   xd->left_txfm_context + blk_row, mbmi->bsize,
                                   tx_size);
  const int txb_size_index = av1_get_txb_size_index(bsize, blk_row, blk_col);
  const TX_SIZE plane_tx_size = mbmi->inter_tx_size[txb_size_index];

  if (blk_row >= max_blocks_high || blk_col >= max_blocks_wide) return;
  assert(tx_size > TX_4X4);

  if (depth == MAX_VARTX_DEPTH) {
    // Don't add to counts in this case
    mbmi->tx_size = tx_size;
    txfm_partition_update(xd->above_txfm_context + blk_col,
                          xd->left_txfm_context + blk_row, tx_size, tx_size);
    return;
  }

  if (tx_size == plane_tx_size) {
#if CONFIG_ENTROPY_STATS
    ++counts->txfm_partition[ctx][0];
#endif
    if (allow_update_cdf)
      update_cdf(xd->tile_ctx->txfm_partition_cdf[ctx], 0, 2);
    mbmi->tx_size = tx_size;
    txfm_partition_update(xd->above_txfm_context + blk_col,
                          xd->left_txfm_context + blk_row, tx_size, tx_size);
  } else {
    const TX_SIZE sub_txs = sub_tx_size_map[tx_size];
    const int bsw = tx_size_wide_unit[sub_txs];
    const int bsh = tx_size_high_unit[sub_txs];

#if CONFIG_ENTROPY_STATS
    ++counts->txfm_partition[ctx][1];
#endif
    if (allow_update_cdf)
      update_cdf(xd->tile_ctx->txfm_partition_cdf[ctx], 1, 2);
    ++x->txfm_search_info.txb_split_count;

    if (sub_txs == TX_4X4) {
      mbmi->inter_tx_size[txb_size_index] = TX_4X4;
      mbmi->tx_size = TX_4X4;
      txfm_partition_update(xd->above_txfm_context + blk_col,
                            xd->left_txfm_context + blk_row, TX_4X4, tx_size);
      return;
    }

    for (int row = 0; row < tx_size_high_unit[tx_size]; row += bsh) {
      for (int col = 0; col < tx_size_wide_unit[tx_size]; col += bsw) {
        int offsetr = row;
        int offsetc = col;

        update_txfm_count(x, xd, counts, sub_txs, depth + 1, blk_row + offsetr,
                          blk_col + offsetc, allow_update_cdf);
      }
    }
  }
}